

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAux.h
# Opt level: O2

void __thiscall BamTools::CustomHeaderTag::~CustomHeaderTag(CustomHeaderTag *this)

{
  std::__cxx11::string::~string((string *)&this->TagValue);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

struct API_EXPORT CustomHeaderTag
{
    std::string TagName;
    std::string TagValue;
}